

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  short sVar4;
  ushort uVar5;
  WhereInfo *pWVar6;
  WhereClause *pWC;
  Parse *pParse;
  SrcList *pSVar7;
  WhereLoop *p;
  ExprList *pEVar8;
  Table *pTab;
  Expr *pEVar9;
  Expr *pEVar10;
  ExprList *pEVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  char *zRight;
  sqlite3_index_info *pIdxInfo;
  Index *pIVar16;
  ulong uVar17;
  WhereTerm *pWVar18;
  ulong uVar19;
  uint uVar20;
  sqlite3_index_orderby *psVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  sqlite3_uint64 sVar26;
  uint uVar27;
  Bitmask mNext;
  ulong uVar28;
  sqlite3_index_constraint *psVar29;
  WhereClause *pWVar30;
  anon_struct_4_9_b482b7ef_for_fg *paVar31;
  ushort uVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  anon_union_8_3_bb5b150a_for_u *paVar37;
  long in_FS_OFFSET;
  bool bVar38;
  uint local_a4;
  ulong local_80;
  int bRetry;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bRetry = 0;
  pWVar6 = pBuilder->pWInfo;
  pParse = pWVar6->pParse;
  pSVar7 = pWVar6->pTabList;
  p = pBuilder->pNew;
  bVar2 = p->iTab;
  pEVar8 = pWVar6->pOrderBy;
  pTab = pSVar7->a[bVar2].pSTab;
  iVar24 = 0;
  pWC = pBuilder->pWC;
  for (pWVar30 = pWC; pWVar30 != (WhereClause *)0x0; pWVar30 = pWVar30->pOuter) {
    pWVar18 = pWVar30->a;
    iVar33 = pWVar30->nTerm;
    if (iVar33 < 1) {
      iVar33 = 0;
    }
    while (bVar38 = iVar33 != 0, iVar33 = iVar33 + -1, bVar38) {
      uVar3 = pWVar18->wtFlags;
      pWVar18->wtFlags = uVar3 & 0xffbf;
      if ((((pWVar18->leftCursor == pSVar7->a[bVar2].iCursor) &&
           ((pWVar18->prereqRight & mUnusable) == 0)) &&
          (-1 < (char)uVar3 && (pWVar18->eOperator & 0xf7ff) != 0)) &&
         (((pSVar7->a[bVar2].fg.jointype & 0x58) == 0 ||
          (iVar13 = constraintCompatibleWithOuterJoin(pWVar18,pSVar7->a + bVar2), iVar13 != 0)))) {
        iVar24 = iVar24 + 1;
        pWVar18->wtFlags = uVar3 | 0x40;
      }
      pWVar18 = pWVar18 + 1;
    }
  }
  if (pEVar8 == (ExprList *)0x0) {
LAB_0018ab69:
    uVar20 = 0;
    uVar27 = 0;
  }
  else {
    uVar20 = pEVar8->nExpr;
    uVar17 = 0;
    uVar34 = 0;
    pEVar11 = pEVar8;
    if (0 < (int)uVar20) {
      uVar34 = (ulong)uVar20;
    }
    for (; paVar31 = &pEVar11->a[0].fg, uVar34 != uVar17; uVar17 = uVar17 + 1) {
      pEVar9 = pEVar11->a[0].pExpr;
      iVar33 = sqlite3ExprIsConstant((Parse *)0x0,pEVar9);
      if (iVar33 != 0) goto LAB_0018ab30;
      if ((paVar31->sortFlags & 2) != 0) {
LAB_0018ab3c:
        uVar34 = uVar17 & 0xffffffff;
        break;
      }
      if (pEVar9->op != 'r') {
        if ((pEVar9->op == 0xa8) && (pEVar9->iTable == pSVar7->a[bVar2].iCursor)) goto LAB_0018ab30;
        goto LAB_0018ab3c;
      }
      pEVar10 = pEVar9->pLeft;
      if ((pEVar10->op != 0xa8) || (pEVar10->iTable != pSVar7->a[bVar2].iCursor)) goto LAB_0018ab3c;
      sVar4 = pEVar10->iColumn;
      pEVar9->iColumn = sVar4;
      if (-1 < (long)sVar4) {
        zRight = sqlite3ColumnColl(pTab->aCol + sVar4);
        if (zRight == (char *)0x0) {
          zRight = "BINARY";
        }
        iVar33 = sqlite3_stricmp((pEVar9->u).zToken,zRight);
        if (iVar33 != 0) goto LAB_0018ab3c;
      }
LAB_0018ab30:
      pEVar11 = (ExprList *)paVar31;
    }
    if ((uint)uVar34 != uVar20) goto LAB_0018ab69;
    uVar3 = pWVar6->wctrlFlags;
    if (((char)uVar3 < '\0') && (-1 < *(short *)&pSVar7->a[bVar2].fg.field_0x1)) {
      uVar27 = uVar3 >> 9 & 1 | 2;
    }
    else {
      uVar27 = uVar3 >> 6 & 1;
    }
  }
  lVar36 = (long)iVar24;
  pIdxInfo = (sqlite3_index_info *)
             sqlite3DbMallocZero(pParse->db,(long)(int)uVar20 * 8 + lVar36 * 0x1c + 0x88);
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    sqlite3ErrorMsg(pParse,"out of memory");
  }
  else {
    psVar29 = (sqlite3_index_constraint *)(&pIdxInfo[1].aConstraintUsage + lVar36);
    psVar21 = (sqlite3_index_orderby *)((long)&pIdxInfo[1].aConstraintUsage + lVar36 * 0x14);
    pIdxInfo->aConstraint = psVar29;
    pIdxInfo->aOrderBy = psVar21;
    pIdxInfo->aConstraintUsage = (sqlite3_index_constraint_usage *)(psVar21 + (int)uVar20);
    sVar26 = pSVar7->a[bVar2].colUsed;
    pIdxInfo->colUsed = sVar26;
    if ((pTab->tabFlags & 0x80) != 0) {
      pIVar16 = sqlite3PrimaryKeyIndex(pTab);
      uVar3 = pIVar16->nKeyCol;
      for (uVar17 = 0; uVar3 != uVar17; uVar17 = uVar17 + 1) {
        uVar34 = (ulong)(ushort)pIVar16->aiColumn[uVar17];
        if (0x3e < pIVar16->aiColumn[uVar17]) {
          uVar34 = 0x3f;
        }
        sVar26 = sVar26 | 1L << (uVar34 & 0x3f);
        pIdxInfo->colUsed = sVar26;
      }
    }
    *(WhereClause **)(pIdxInfo + 1) = pWC;
    pIdxInfo[1].aConstraint = (sqlite3_index_constraint *)pParse;
    pIdxInfo[1].nOrderBy = uVar27;
    *(undefined4 *)&pIdxInfo[1].field_0x14 = 0;
    uVar27 = 0;
    local_a4 = 0;
    iVar24 = 0;
    iVar33 = 0;
    for (pWVar30 = pWC; pWVar30 != (WhereClause *)0x0; pWVar30 = pWVar30->pOuter) {
      iVar13 = pWVar30->nTerm + iVar33;
      paVar37 = &pWVar30->a->u;
      for (; iVar33 < iVar13; iVar33 = iVar33 + 1) {
        uVar3 = *(u16 *)((long)paVar37 + -0xe);
        if ((uVar3 & 0x40) != 0) {
          lVar25 = (long)iVar24;
          psVar29[lVar25].iColumn = (paVar37->x).leftColumn;
          (&pIdxInfo[1].idxNum)[lVar36 * 2 + lVar25 * 3] = iVar33;
          uVar5 = *(u16 *)((long)paVar37 + -0xc);
          uVar32 = uVar5 & 0x3fff;
          if (uVar32 == 1) {
            if (-1 < (short)uVar3) {
              uVar15 = 1 << ((byte)iVar24 & 0x1f);
              if (0x1f < iVar24) {
                uVar15 = 0;
              }
              uVar27 = uVar27 | uVar15;
              *(uint *)&pIdxInfo[1].field_0x14 = uVar27;
            }
            psVar29[lVar25].op = '\x02';
          }
          else if (uVar32 == 0x40) {
            psVar29[lVar25].op = *(u8 *)((long)paVar37 + -9);
          }
          else if ((uVar5 & 0x180) == 0) {
            psVar29[lVar25].op = (uchar)uVar5;
            if (((uVar5 & 0x3c) != 0) &&
               (iVar14 = sqlite3ExprIsVector(((WhereTerm *)(paVar37 + -4))->pExpr->pRight),
               iVar14 != 0)) {
              uVar15 = 1 << ((byte)iVar24 & 0x1f);
              if (0xf < iVar24) {
                uVar15 = 0;
              }
              local_a4 = local_a4 | uVar15;
              if (uVar32 == 4) {
                psVar29[lVar25].op = ' ';
              }
              else if (uVar32 == 0x10) {
                psVar29[lVar25].op = '\b';
              }
            }
          }
          else if (uVar32 == 0x100) {
            psVar29[lVar25].op = 'G';
          }
          else {
            psVar29[lVar25].op = 'H';
          }
          iVar24 = iVar24 + 1;
        }
        paVar37 = paVar37 + 7;
      }
    }
    pIdxInfo->nConstraint = iVar24;
    uVar34 = 0;
    uVar17 = (ulong)uVar20;
    if ((int)uVar20 < 1) {
      uVar17 = uVar34;
    }
    iVar24 = 0;
    for (; uVar17 * 0x18 - uVar34 != 0; uVar34 = uVar34 + 0x18) {
      pEVar9 = *(Expr **)((long)&pEVar8->a[0].pExpr + uVar34);
      iVar33 = sqlite3ExprIsConstant((Parse *)0x0,pEVar9);
      if (iVar33 == 0) {
        psVar21[iVar24].iColumn = (int)pEVar9->iColumn;
        *(byte *)((long)&pIdxInfo[1].aConstraintUsage + (long)iVar24 * 8 + lVar36 * 0x14 + 4) =
             (&pEVar8->a[0].fg.sortFlags)[uVar34] & 1;
        iVar24 = iVar24 + 1;
      }
    }
    pIdxInfo->nOrderBy = iVar24;
    p->rSetup = 0;
    p->wsFlags = 0x400;
    p->nLTerm = 0;
    pbVar1 = (byte *)((long)&p->u + 4);
    *pbVar1 = *pbVar1 & 0xfe;
    uVar20 = pIdxInfo->nConstraint;
    iVar24 = whereLoopResize(pParse->db,p,uVar20);
    if (iVar24 == 0) {
      local_3c = -0x55555556;
      iVar24 = whereLoopAddVirtualOne
                         (pBuilder,mPrereq,0xffffffffffffffff,0,pIdxInfo,(u16)local_a4,&local_3c,
                          &bRetry);
      if (bRetry != 0) {
        iVar24 = whereLoopAddVirtualOne
                           (pBuilder,mPrereq,0xffffffffffffffff,0,pIdxInfo,(u16)local_a4,&local_3c,
                            (int *)0x0);
      }
      if (iVar24 == 0) {
        uVar34 = ~mPrereq;
        uVar17 = p->prereq & uVar34;
        iVar24 = 0;
        if (local_3c != 0 || uVar17 != 0) {
          if (local_3c == 0) {
            bVar38 = false;
            local_80 = 0;
            iVar24 = 0;
          }
          else {
            iVar24 = whereLoopAddVirtualOne
                               (pBuilder,mPrereq,0xffffffffffffffff,1,pIdxInfo,(u16)local_a4,
                                &local_3c,(int *)0x0);
            local_80 = p->prereq & uVar34;
            bVar38 = local_80 == 0;
          }
          uVar22 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar22 = 0;
          }
          bVar12 = !bVar38;
          uVar35 = 0;
          while (iVar24 == 0) {
            uVar28 = 0xffffffffffffffff;
            for (lVar36 = 0; uVar22 * 0xc - lVar36 != 0; lVar36 = lVar36 + 0xc) {
              pWVar18 = termFromWhereClause(pWC,*(int *)((long)&pIdxInfo->aConstraint->iTermOffset +
                                                        lVar36));
              uVar19 = pWVar18->prereqRight & uVar34;
              uVar23 = uVar28;
              if (uVar19 < uVar28) {
                uVar23 = uVar19;
              }
              if (uVar35 < uVar19) {
                uVar28 = uVar23;
              }
            }
            if (uVar28 == 0xffffffffffffffff) {
              iVar24 = 0;
              if ((bVar12) &&
                 (iVar24 = whereLoopAddVirtualOne
                                     (pBuilder,mPrereq,mPrereq,0,pIdxInfo,(u16)local_a4,&local_3c,
                                      (int *)0x0), local_3c == 0)) {
                bVar38 = true;
              }
              if (!bVar38 && iVar24 == 0) {
                iVar24 = whereLoopAddVirtualOne
                                   (pBuilder,mPrereq,mPrereq,1,pIdxInfo,(u16)local_a4,&local_3c,
                                    (int *)0x0);
              }
              break;
            }
            iVar24 = 0;
            uVar35 = uVar28;
            if (((uVar28 != uVar17) && (uVar28 != local_80)) &&
               (iVar24 = whereLoopAddVirtualOne
                                   (pBuilder,mPrereq,uVar28 | mPrereq,0,pIdxInfo,(u16)local_a4,
                                    &local_3c,(int *)0x0), p->prereq == mPrereq)) {
              if (local_3c == 0) {
                bVar38 = true;
              }
              bVar12 = false;
            }
          }
        }
      }
      freeIndexInfo(pParse->db,pIdxInfo);
      goto LAB_0018b10a;
    }
    freeIndexInfo(pParse->db,pIdxInfo);
  }
  iVar24 = 7;
LAB_0018b10a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar24;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  SrcItem *pSrc;               /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;
  int bRetry = 0;              /* True to retry with LIMIT/OFFSET disabled */

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pSTab) );
  p = allocateIndexInfo(pWInfo, pWC, mUnusable, pSrc, &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    freeIndexInfo(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pSTab->zName));
  WHERETRACE(0x800, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(
      pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, &bRetry
  );
  if( bRetry ){
    assert( rc==SQLITE_OK );
    rc = whereLoopAddVirtualOne(
        pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, 0
    );
  }

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x800, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn, 0);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq)
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        int iTerm = p->aConstraint[i].iTermOffset;
        Bitmask mThis = termFromWhereClause(pWC, iTerm)->prereqRight & ~mPrereq;
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x800, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn, 0);
    }
  }

  freeIndexInfo(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pSTab->zName, rc));
  return rc;
}